

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O3

void __thiscall
MemoryEditor::CalcSizes(MemoryEditor *this,Sizes *s,size_t mem_size,size_t base_display_addr)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ImGuiStyle *pIVar4;
  ulong uVar5;
  float fVar6;
  ImVec2 IVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pIVar4 = ImGui::GetStyle();
  iVar3 = this->OptAddrDigitsCount;
  s->AddrDigitsCount = iVar3;
  if ((iVar3 == 0) && (uVar5 = (mem_size + base_display_addr) - 1, uVar5 != 0)) {
    iVar3 = 0;
    do {
      iVar3 = iVar3 + 1;
      bVar2 = 0xf < uVar5;
      uVar5 = uVar5 >> 4;
    } while (bVar2);
    s->AddrDigitsCount = iVar3;
  }
  fVar6 = ImGui::GetTextLineHeight();
  s->LineHeight = fVar6;
  IVar7 = ImGui::CalcTextSize("F",(char *)0x0,false,-1.0);
  fVar6 = IVar7.x + 1.0;
  s->GlyphWidth = fVar6;
  fVar8 = (float)(int)(fVar6 * 2.5);
  s->HexCellWidth = fVar8;
  s->SpacingBetweenMidCols = (float)(int)(fVar8 * 0.25);
  fVar10 = (float)(s->AddrDigitsCount + 2) * fVar6;
  s->PosHexStart = fVar10;
  iVar3 = this->Cols;
  fVar9 = (float)iVar3;
  fVar10 = fVar8 * fVar9 + fVar10;
  s->PosHexEnd = fVar10;
  s->PosAsciiEnd = fVar10;
  s->PosAsciiStart = fVar10;
  if (this->OptShowAscii == true) {
    fVar10 = fVar10 + fVar6;
    s->PosAsciiStart = fVar10;
    iVar1 = this->OptMidColsCount;
    if (0 < iVar1) {
      fVar10 = fVar10 + (float)((iVar3 + iVar1 + -1) / iVar1) * (float)(int)(fVar8 * 0.25);
      s->PosAsciiStart = fVar10;
    }
    fVar10 = fVar10 + fVar9 * fVar6;
    s->PosAsciiEnd = fVar10;
  }
  fVar8 = (pIVar4->WindowPadding).x;
  s->WindowWidth = fVar6 + fVar8 + fVar8 + fVar10 + pIVar4->ScrollbarSize;
  return;
}

Assistant:

void CalcSizes(Sizes& s, size_t mem_size, size_t base_display_addr)
    {
        ImGuiStyle& style = ImGui::GetStyle();
        s.AddrDigitsCount = OptAddrDigitsCount;
        if (s.AddrDigitsCount == 0)
            for (size_t n = base_display_addr + mem_size - 1; n > 0; n >>= 4)
                s.AddrDigitsCount++;
        s.LineHeight = ImGui::GetTextLineHeight();
        s.GlyphWidth = ImGui::CalcTextSize("F").x + 1;                  // We assume the font is mono-space
        s.HexCellWidth = (float)(int)(s.GlyphWidth * 2.5f);             // "FF " we include trailing space in the width to easily catch clicks everywhere
        s.SpacingBetweenMidCols = (float)(int)(s.HexCellWidth * 0.25f); // Every OptMidColsCount columns we add a bit of extra spacing
        s.PosHexStart = (s.AddrDigitsCount + 2) * s.GlyphWidth;
        s.PosHexEnd = s.PosHexStart + (s.HexCellWidth * Cols);
        s.PosAsciiStart = s.PosAsciiEnd = s.PosHexEnd;
        if (OptShowAscii)
        {
            s.PosAsciiStart = s.PosHexEnd + s.GlyphWidth * 1;
            if (OptMidColsCount > 0)
                s.PosAsciiStart += (float)((Cols + OptMidColsCount - 1) / OptMidColsCount) * s.SpacingBetweenMidCols;
            s.PosAsciiEnd = s.PosAsciiStart + Cols * s.GlyphWidth;
        }
        s.WindowWidth = s.PosAsciiEnd + style.ScrollbarSize + style.WindowPadding.x * 2 + s.GlyphWidth;
    }